

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cc
# Opt level: O0

ostream * pstack::operator<<(ostream *os,JSON<pstack::Elf::Object,_char> *elf)

{
  byte bVar1;
  bool bVar2;
  Ehdr *pEVar3;
  JObject *pJVar4;
  SymbolVersioning *v;
  ostream *poVar5;
  char *local_e8;
  char local_c1;
  string local_c0;
  string local_a0;
  char local_7a [2];
  Notes local_78;
  Object *local_70;
  char local_62 [2];
  char *local_60;
  char local_55 [20];
  char local_41;
  undefined1 local_40 [8];
  JObject writer;
  Mapper<pstack::ProgramHeaderName,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::map<unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>_>_>_>
  mappedSegments;
  uchar brand;
  Ehdr *ehdr;
  JSON<pstack::Elf::Object,_char> *elf_local;
  ostream *os_local;
  
  pEVar3 = Elf::Object::getHeader(elf->object);
  bVar1 = pEVar3->e_ident[7];
  Mapper<pstack::ProgramHeaderName,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::map<unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>_>_>_>
  ::Mapper((Mapper<pstack::ProgramHeaderName,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::map<unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>_>_>_>
            *)&writer.sep,&elf->object->programHeaders);
  JObject::JObject((JObject *)local_40,os);
  local_41 = '\0';
  pJVar4 = JObject::field<char[5],char_const*,char>
                     ((JObject *)local_40,(char (*) [5])0x2a8a10,
                      operator<<::typeNames + pEVar3->e_type,&local_41);
  local_55[0] = '\0';
  pJVar4 = JObject::field<char[6],unsigned_long,char>
                     (pJVar4,(char (*) [6])0x2a5d54,&pEVar3->e_entry,local_55);
  if (bVar1 < 0xd) {
    local_e8 = operator<<::abiNames[bVar1];
  }
  else {
    local_e8 = (char *)0x0;
  }
  local_60 = local_e8;
  local_62[1] = 0;
  pJVar4 = JObject::field<char[4],char_const*,char>
                     (pJVar4,(char (*) [4])"abi",&local_60,local_62 + 1);
  local_62[0] = '\0';
  pJVar4 = JObject::
           field<char[9],std::vector<std::unique_ptr<pstack::Elf::Section,std::default_delete<pstack::Elf::Section>>,std::allocator<std::unique_ptr<pstack::Elf::Section,std::default_delete<pstack::Elf::Section>>>>,char>
                     (pJVar4,(char (*) [9])"sections",&elf->object->sectionHeaders,local_62);
  local_70 = elf->object;
  pJVar4 = JObject::
           field<char[9],pstack::Mapper<pstack::ProgramHeaderName,std::vector<Elf64_Phdr,std::allocator<Elf64_Phdr>>,std::map<unsigned_int,std::vector<Elf64_Phdr,std::allocator<Elf64_Phdr>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<Elf64_Phdr,std::allocator<Elf64_Phdr>>>>>>,pstack::Elf::Object_const*>
                     (pJVar4,(char (*) [9])"segments",
                      (Mapper<pstack::ProgramHeaderName,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::map<unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>_>_>_>
                       *)&writer.sep,&local_70);
  local_78 = Elf::Object::notes(elf->object);
  local_7a[1] = 0;
  pJVar4 = JObject::field<char[6],pstack::Elf::Notes,char>
                     (pJVar4,(char (*) [6])"notes",&local_78,local_7a + 1);
  v = Elf::Object::symbolVersions(elf->object);
  local_7a[0] = '\0';
  JObject::field<char[12],pstack::Elf::SymbolVersioning,char>
            (pJVar4,(char (*) [12])"versioninfo",v,local_7a);
  Elf::Object::getInterpreter_abi_cxx11_(&local_a0,elf->object);
  bVar2 = std::operator==(&local_a0,"");
  std::__cxx11::string::~string((string *)&local_a0);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    Elf::Object::getInterpreter_abi_cxx11_(&local_c0,elf->object);
    local_c1 = '\0';
    JObject::field<char[12],std::__cxx11::string,char>
              ((JObject *)local_40,(char (*) [12])"interpreter",&local_c0,&local_c1);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  poVar5 = JObject::operator_cast_to_ostream_((JObject *)local_40);
  JObject::~JObject((JObject *)local_40);
  return poVar5;
}

Assistant:

std::ostream &operator<< (std::ostream &os, const JSON<Elf::Object> &elf)
{
    static const char *typeNames[] = {
         "ET_NONE",
         "ET_REL",
         "ET_EXEC",
         "ET_DYN",
         "ET_CORE"
    };

    static const char *abiNames[] = {
        "SYSV/NONE",
        "HP-UX",
        "NetBSD",
        "Linux",
        "Hurd",
        "86Open",
        "Solaris",
        "Monterey",
        "Irix",
        "FreeBSD",
        "Tru64",
        "Modesto",
        "OpenBSD"
    };

    auto &ehdr = elf.object.getHeader();
    auto brand = ehdr.e_ident[EI_OSABI];

    Mapper<ProgramHeaderName, decltype(elf.object.programHeaders)::mapped_type,
       std::map<Elf::Word, Elf::Object::ProgramHeaders>> mappedSegments(elf.object.programHeaders);
    JObject writer(os);
    writer
        .field("type", typeNames[ehdr.e_type])
        .field("entry", ehdr.e_entry)
        .field("abi", brand < sizeof abiNames / sizeof abiNames[0]? abiNames[brand] : nullptr)
        .field("sections", elf.object.sectionHeaders)
        .field("segments", mappedSegments, &elf.object)
        .field("notes", elf.object.notes())
        .field("versioninfo", *elf.object.symbolVersions())
        ;

    if (elf.object.getInterpreter() != "")
        writer.field("interpreter", elf.object.getInterpreter());
    return writer;
}